

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

int isscalar(Context *ctx,MOJOSHADER_shaderType shader_type,RegisterType rtype,int rnum)

{
  RegisterList *pRVar1;
  uint uVar2;
  bool bVar3;
  
  switch(rtype) {
  case REG_TYPE_RASTOUT:
    bVar3 = rnum - 1U < 2;
    break;
  case REG_TYPE_OUTPUT:
    if ((ctx->uses_pointsize != 0 || ctx->uses_fog != 0) &&
       (pRVar1 = (ctx->attributes).next, pRVar1 != (RegisterList *)0x0)) {
      do {
        uVar2 = pRVar1->regtype << 0x10 | pRVar1->regnum;
        if ((rnum | 0x60000U) == uVar2) {
          bVar3 = pRVar1->usage == MOJOSHADER_USAGE_FOG && ctx->uses_fog != 0 ||
                  pRVar1->usage == MOJOSHADER_USAGE_POINTSIZE && ctx->uses_pointsize != 0;
          goto LAB_00119e43;
        }
      } while ((uVar2 <= (rnum | 0x60000U)) &&
              (pRVar1 = pRVar1->next, pRVar1 != (RegisterList *)0x0));
    }
  default:
    bVar3 = false;
    break;
  case REG_TYPE_DEPTHOUT:
  case REG_TYPE_CONSTBOOL:
  case REG_TYPE_LOOP:
    bVar3 = true;
    break;
  case REG_TYPE_MISCTYPE:
    shader_type = rnum;
    goto LAB_00119df7;
  case REG_TYPE_MAX:
LAB_00119df7:
    bVar3 = shader_type == MOJOSHADER_TYPE_PIXEL;
  }
LAB_00119e43:
  return (int)bVar3;
}

Assistant:

static int isscalar(Context *ctx, const MOJOSHADER_shaderType shader_type,
                    const RegisterType rtype, const int rnum)
{
    const int uses_psize = ctx->uses_pointsize;
    const int uses_fog = ctx->uses_fog;
    if ( (rtype == REG_TYPE_OUTPUT) && ((uses_psize) || (uses_fog)) )
    {
        const RegisterList *reg = reglist_find(&ctx->attributes, rtype, rnum);
        if (reg != NULL)
        {
            const MOJOSHADER_usage usage = reg->usage;
            return ( (uses_psize && (usage == MOJOSHADER_USAGE_POINTSIZE)) ||
                     (uses_fog && (usage == MOJOSHADER_USAGE_FOG)) );
        } // if
    } // if

    return scalar_register(shader_type, rtype, rnum);
}